

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O1

vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *
vk::enumerateInstanceExtensionProperties
          (vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
           *__return_storage_ptr__,PlatformInterface *vkp,char *layerName)

{
  VkResult VVar1;
  TestError *this;
  deUint32 numExtensions;
  uint local_1c;
  
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c = 0;
  VVar1 = (*vkp->_vptr_PlatformInterface[2])(vkp,layerName,&local_1c,0);
  checkResult(VVar1,"vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, DE_NULL)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
              ,0xc2);
  if ((ulong)local_1c != 0) {
    std::vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::resize
              (__return_storage_ptr__,(ulong)local_1c);
    VVar1 = (*vkp->_vptr_PlatformInterface[2])
                      (vkp,layerName,&local_1c,
                       (__return_storage_ptr__->
                       super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    checkResult(VVar1,
                "vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, &properties[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                ,199);
    if (((long)(__return_storage_ptr__->
               super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(__return_storage_ptr__->
               super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
               )._M_impl.super__Vector_impl_data._M_start >> 2) * 0xfc0fc0fc0fc0fc1 -
        (ulong)local_1c != 0) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,(char *)0x0,"(size_t)numExtensions == properties.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,200);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VkExtensionProperties> enumerateInstanceExtensionProperties (const PlatformInterface& vkp, const char* layerName)
{
	vector<VkExtensionProperties>	properties;
	deUint32						numExtensions	= 0;

	VK_CHECK(vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, DE_NULL));

	if (numExtensions > 0)
	{
		properties.resize(numExtensions);
		VK_CHECK(vkp.enumerateInstanceExtensionProperties(layerName, &numExtensions, &properties[0]));
		TCU_CHECK((size_t)numExtensions == properties.size());
	}

	return properties;
}